

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::ECHServerConfig::Init
          (ECHServerConfig *this,Span<const_unsigned_char> ech_config,EVP_HPKE_KEY *key,
          bool is_retry_config)

{
  Span<const_unsigned_char> *pSVar1;
  uint16_t uVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  EVP_HPKE_AEAD *pEVar7;
  EVP_HPKE_KEM *kem;
  evp_hpke_key_st *dst;
  bool local_109;
  Span<unsigned_char> local_f0;
  Span<const_unsigned_char> local_e0;
  size_t local_d0;
  size_t expected_public_key_len;
  uint8_t expected_public_key [65];
  uint16_t aead_id;
  uint16_t kdf_id;
  undefined1 local_70 [8];
  CBS cipher_suites;
  bool supported;
  undefined1 local_48 [8];
  CBS cbs;
  bool is_retry_config_local;
  EVP_HPKE_KEY *key_local;
  ECHServerConfig *this_local;
  Span<const_unsigned_char> ech_config_local;
  
  this->is_retry_config_ = is_retry_config;
  cbs.len._7_1_ = is_retry_config;
  cbs_st::cbs_st((cbs_st *)local_48,ech_config);
  bVar3 = parse_ech_config((CBS *)local_48,&this->ech_config_,(bool *)((long)&cipher_suites.len + 7)
                           ,true);
  if (bVar3) {
    sVar6 = CBS_len((CBS *)local_48);
    if (sVar6 == 0) {
      if ((cipher_suites.len._7_1_ & 1) == 0) {
        ERR_put_error(0x10,0,0x138,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0x201);
      }
      else {
        pSVar1 = &(this->ech_config_).cipher_suites;
        unique0x00012000 = pSVar1->data_;
        cbs_st::cbs_st((cbs_st *)local_70,*pSVar1);
        do {
          sVar6 = CBS_len((CBS *)local_70);
          if (sVar6 == 0) {
            iVar5 = EVP_HPKE_KEY_public_key(key,(uint8_t *)&expected_public_key_len,&local_d0,0x41);
            if (iVar5 == 0) {
              return false;
            }
            uVar2 = (this->ech_config_).kem_id;
            kem = EVP_HPKE_KEY_kem(key);
            uVar4 = EVP_HPKE_KEM_id(kem);
            local_109 = true;
            if (uVar2 == uVar4) {
              Span<unsigned_char>::Span(&local_f0,(uchar *)&expected_public_key_len,local_d0);
              Span<unsigned_char_const>::
              Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                        ((Span<unsigned_char_const> *)&local_e0,&local_f0);
              local_109 = internal::operator!=(local_e0,(this->ech_config_).public_key);
            }
            if (local_109 != false) {
              ERR_put_error(0x10,0,0x136,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0x220);
              return false;
            }
            dst = internal::
                  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  ::get(&this->key_);
            iVar5 = EVP_HPKE_KEY_copy(dst,key);
            if (iVar5 != 0) {
              return true;
            }
            return false;
          }
          iVar5 = CBS_get_u16((CBS *)local_70,(uint16_t *)(expected_public_key + 0x3e));
          if ((iVar5 == 0) ||
             (iVar5 = CBS_get_u16((CBS *)local_70,(uint16_t *)(expected_public_key + 0x3c)),
             iVar5 == 0)) {
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                          ,0x20a);
            return false;
          }
        } while ((expected_public_key._62_2_ == 1) &&
                (pEVar7 = get_ech_aead(expected_public_key._60_2_), pEVar7 != (EVP_HPKE_AEAD *)0x0))
        ;
        ERR_put_error(0x10,0,0x138,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0x210);
      }
    }
    else {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x1fd);
    }
  }
  return false;
}

Assistant:

bool ECHServerConfig::Init(Span<const uint8_t> ech_config,
                           const EVP_HPKE_KEY *key, bool is_retry_config) {
  is_retry_config_ = is_retry_config;

  // Parse the ECHConfig, rejecting all unsupported parameters and extensions.
  // Unlike most server options, ECH's server configuration is serialized and
  // configured in both the server and DNS. If the caller configures an
  // unsupported parameter, this is a deployment error. To catch these errors,
  // we fail early.
  CBS cbs = ech_config;
  bool supported;
  if (!parse_ech_config(&cbs, &ech_config_, &supported,
                        /*all_extensions_mandatory=*/true)) {
    return false;
  }
  if (CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  if (!supported) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_ECH_SERVER_CONFIG);
    return false;
  }

  CBS cipher_suites = ech_config_.cipher_suites;
  while (CBS_len(&cipher_suites) > 0) {
    uint16_t kdf_id, aead_id;
    if (!CBS_get_u16(&cipher_suites, &kdf_id) ||
        !CBS_get_u16(&cipher_suites, &aead_id)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    // The server promises to support every option in the ECHConfig, so reject
    // any unsupported cipher suites.
    if (kdf_id != EVP_HPKE_HKDF_SHA256 || get_ech_aead(aead_id) == nullptr) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_ECH_SERVER_CONFIG);
      return false;
    }
  }

  // Check the public key in the ECHConfig matches |key|.
  uint8_t expected_public_key[EVP_HPKE_MAX_PUBLIC_KEY_LENGTH];
  size_t expected_public_key_len;
  if (!EVP_HPKE_KEY_public_key(key, expected_public_key,
                               &expected_public_key_len,
                               sizeof(expected_public_key))) {
    return false;
  }
  if (ech_config_.kem_id != EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(key)) ||
      Span(expected_public_key, expected_public_key_len) !=
          ech_config_.public_key) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_ECH_SERVER_CONFIG_AND_PRIVATE_KEY_MISMATCH);
    return false;
  }

  if (!EVP_HPKE_KEY_copy(key_.get(), key)) {
    return false;
  }

  return true;
}